

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O0

void __thiscall gv_visitor::visit(gv_visitor *this,IntValue *ptr)

{
  IntValue *ptr_00;
  ostream *this_00;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream stream;
  ostream local_190 [376];
  IntValue *local_18;
  IntValue *ptr_local;
  gv_visitor *this_local;
  
  local_18 = ptr;
  ptr_local = (IntValue *)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = std::operator<<(local_190,"int: ");
  std::ostream::operator<<(this_00,local_18->value);
  ptr_00 = local_18;
  std::__cxx11::stringstream::str();
  box(this,ptr_00,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void gv_visitor::visit(IntValue* ptr) {
    std::stringstream stream;
    stream << "int: " << ptr->value;
    box(ptr, stream.str());
    //value(int)
}